

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::operator-=(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
             *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *vec)

{
  uint n;
  ulong uVar1;
  cpp_dec_float<50U,_int,_void> cStack_58;
  
  if (vec->setupStatus == true) {
    n = (vec->super_IdxSet).num;
    while (0 < (int)n) {
      n = n - 1;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::value((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&cStack_58,vec,n);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)
                 ((long)(vec->super_IdxSet).idx[n] * 0x38 + *(long *)this),&cStack_58);
    }
  }
  else {
    uVar1 = (*(long *)(this + 8) - *(long *)this) / 0x38 & 0xffffffff;
    while (0 < (int)uVar1) {
      uVar1 = uVar1 - 1;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&cStack_58,vec,(int)uVar1);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)((uVar1 & 0xffffffff) * 0x38 + *(long *)this),
                 &cStack_58);
    }
  }
  return (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
VectorBase<R>& VectorBase<R>::operator-=(const SSVectorBase<S>& vec)
{
   assert(dim() == vec.dim());

   if(vec.isSetup())
   {
      for(int i = vec.size() - 1; i >= 0; --i)
         val[vec.index(i)] -= vec.value(i);
   }
   else
   {
      for(int i = dim() - 1; i >= 0; --i)
         val[i] -= vec[i];
   }

   return *this;
}